

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O1

FScanner * __thiscall FScanner::operator=(FScanner *this,FScanner *other)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (this != other) {
    if (other->ScriptOpen == false) {
      this->ScriptOpen = false;
      FString::operator=(&this->ScriptBuffer,(char *)"");
      FString::operator=(&this->BigStringBuffer,(char *)"");
      this->StringBuffer[0] = '\0';
      this->String = this->StringBuffer;
    }
    else {
      this->ScriptOpen = true;
      FString::operator=(&this->ScriptName,&other->ScriptName);
      FString::operator=(&this->ScriptBuffer,&other->ScriptBuffer);
      this->ScriptPtr = other->ScriptPtr;
      this->ScriptEndPtr = other->ScriptEndPtr;
      this->AlreadyGot = other->AlreadyGot;
      this->AlreadyGotLine = other->AlreadyGotLine;
      this->LastGotToken = other->LastGotToken;
      this->LastGotPtr = other->LastGotPtr;
      this->LastGotLine = other->LastGotLine;
      this->CMode = other->CMode;
      this->Escape = other->Escape;
      this->StateMode = other->StateMode;
      this->StateOptions = other->StateOptions;
      if (other->String == other->StringBuffer) {
        pcVar1 = this->StringBuffer;
        pcVar3 = other->StringBuffer;
        pcVar4 = pcVar1;
        for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
          *(undefined8 *)pcVar4 = *(undefined8 *)pcVar3;
          pcVar3 = pcVar3 + (ulong)bVar5 * -0x10 + 8;
          pcVar4 = pcVar4 + (ulong)bVar5 * -0x10 + 8;
        }
        FString::operator=(&this->BigStringBuffer,(char *)"");
      }
      else {
        FString::operator=(&this->BigStringBuffer,&other->BigStringBuffer);
        pcVar1 = FString::LockBuffer(&this->BigStringBuffer);
      }
      this->String = pcVar1;
      this->StringLen = other->StringLen;
      this->TokenType = other->TokenType;
      this->Number = other->Number;
      this->Float = other->Float;
      (this->Name).Index = (other->Name).Index;
      this->Line = other->Line;
      this->End = other->End;
      this->Crossed = other->Crossed;
    }
  }
  return this;
}

Assistant:

FScanner &FScanner::operator=(const FScanner &other)
{
	if (this == &other)
	{
		return *this;
	}
	if (!other.ScriptOpen)
	{
		Close();
		return *this;
	}

	// Copy protected members
	ScriptOpen = true;
	ScriptName = other.ScriptName;
	ScriptBuffer = other.ScriptBuffer;
	ScriptPtr = other.ScriptPtr;
	ScriptEndPtr = other.ScriptEndPtr;
	AlreadyGot = other.AlreadyGot;
	AlreadyGotLine = other.AlreadyGotLine;
	LastGotToken = other.LastGotToken;
	LastGotPtr = other.LastGotPtr;
	LastGotLine = other.LastGotLine;
	CMode = other.CMode;
	Escape = other.Escape;
	StateMode = other.StateMode;
	StateOptions = other.StateOptions;

	// Copy public members
	if (other.String == other.StringBuffer)
	{
		memcpy(StringBuffer, other.StringBuffer, sizeof(StringBuffer));
		BigStringBuffer = "";
		String = StringBuffer;
	}
	else
	{
		// Past practice means the string buffer must be writeable, which
		// removes some of the benefit from using an FString to store
		// the big string buffer.
		BigStringBuffer = other.BigStringBuffer;
		String = BigStringBuffer.LockBuffer();
	}
	StringLen = other.StringLen;
	TokenType = other.TokenType;
	Number = other.Number;
	Float = other.Float;
	Name = other.Name;
	Line = other.Line;
	End = other.End;
	Crossed = other.Crossed;

	return *this;
}